

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O2

RK_S32 mpp_hevc_output_frame(void *ctx,int flush)

{
  RK_U8 *pRVar1;
  byte bVar2;
  int iVar3;
  HEVCContext *s_00;
  HEVCSPS *pHVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  HEVCContext *s;
  ulong uVar11;
  HEVCFrame *pHVar12;
  long lVar13;
  HEVCFrame *pHVar14;
  
  s_00 = *ctx;
  lVar13 = *(long *)((long)ctx + 0x50);
  if (*(int *)(lVar13 + 0x1c) == 0) {
    iVar10 = 0x7fffffff;
    uVar11 = 0;
    iVar9 = 0;
    uVar8 = 0;
    while( true ) {
      for (; uVar11 != 0x11; uVar11 = uVar11 + 1) {
        if (((s_00->DPB[uVar11].flags & 1) != 0) && (s_00->DPB[uVar11].sequence == s_00->seq_output)
           ) {
          iVar9 = iVar9 + 1;
          iVar3 = s_00->DPB[uVar11].poc;
          if (iVar3 < iVar10) {
            uVar8 = uVar11 & 0xffffffff;
            iVar10 = iVar3;
          }
        }
      }
      if ((((flush == 0) && (s_00->seq_output == s_00->seq_decode)) &&
          (pHVar4 = s_00->sps, pHVar4 != (HEVCSPS *)0x0)) &&
         (iVar9 <= pHVar4->temporal_layer[(long)pHVar4->max_sub_layers + -1].num_reorder_pics)) {
        if (*(int *)(lVar13 + 0x38) == 0) {
          return 0;
        }
        if ((uint)(s_00->nal_unit_type + ~(NAL_RASL_N|NAL_RADL_R)) < 3) {
          if (s_00->first_i_fast_play != 0) {
            return 0;
          }
        }
        else if (1 < (uint)(s_00->nal_unit_type + ~NAL_BLA_N_LP)) {
          return 0;
        }
        s_00->first_i_fast_play = 1;
      }
      if (iVar9 != 0) {
        iVar10 = (int)uVar8;
        pRVar1 = &s_00->DPB[iVar10].flags;
        *pRVar1 = *pRVar1 & 0xfe;
        pHVar14 = s_00->DPB + iVar10;
        s_00->output_frame_idx = (RK_U8)uVar8;
        mpp_buf_slot_set_flag(s_00->slots,s_00->DPB[iVar10].slot_index,SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(s_00->slots,s_00->DPB[iVar10].slot_index,QUEUE_DISPLAY);
        if (((byte)h265d_debug & 0x80) != 0) {
          _mpp_log_l(4,"H265D_PARSER","Output frame with POC %d frame->slot_index = %d\n",
                     (char *)0x0,(ulong)(uint)pHVar14->poc,(ulong)(uint)pHVar14->slot_index);
        }
        uVar8 = 0;
        bVar6 = false;
        do {
          while (bVar5 = bVar6, uVar7 = (uint)uVar8, uVar7 < 0x11) {
            bVar2 = s_00->DPB[uVar8].flags;
            if ((((bVar2 & 1) != 0) &&
                (pHVar12 = s_00->DPB + uVar8, pHVar12->sequence == s_00->seq_output)) &&
               (pHVar12->poc == pHVar14->poc + 1)) {
              s_00->output_frame_idx = (RK_U8)uVar8;
              pHVar12->flags = bVar2 & 0xfe;
              mpp_buf_slot_set_flag(s_00->slots,pHVar12->slot_index,SLOT_QUEUE_USE);
              mpp_buf_slot_enqueue(s_00->slots,pHVar12->slot_index,QUEUE_DISPLAY);
              if (((byte)h265d_debug & 0x80) != 0) {
                _mpp_log_l(4,"H265D_PARSER",
                           "Output frame with POC %d frm_next_ready->slot_index = %d\n",(char *)0x0,
                           (ulong)(uint)pHVar12->poc,(ulong)(uint)pHVar12->slot_index);
              }
              for (lVar13 = 0xcd0; lVar13 != 0x1110; lVar13 = lVar13 + 0x40) {
                mpp_hevc_unref_frame(s_00,(HEVCFrame *)((long)s_00->vps_list + lVar13 + -0x30),0);
              }
              uVar7 = 0x11;
              bVar5 = true;
              pHVar14 = pHVar12;
            }
            bVar6 = bVar5;
            uVar8 = (ulong)(uVar7 + 1);
          }
          uVar8 = 0;
          bVar6 = false;
        } while (bVar5);
        return 1;
      }
      if (s_00->seq_output == s_00->seq_decode) break;
      s_00->seq_output = s_00->seq_output + 1 & 0xff;
      uVar11 = 0;
      iVar9 = 0;
      iVar10 = 0x7fffffff;
      uVar8 = 0;
    }
  }
  else {
    pHVar14 = s_00->ref;
    if ((pHVar14 != (HEVCFrame *)0x0) && ((pHVar14->flags & 1) != 0)) {
      pHVar14->flags = pHVar14->flags & 0xfe;
      mpp_buf_slot_set_flag(s_00->slots,pHVar14->slot_index,SLOT_QUEUE_USE);
      mpp_buf_slot_enqueue(s_00->slots,s_00->ref->slot_index,QUEUE_DISPLAY);
    }
  }
  return 0;
}

Assistant:

static RK_S32 mpp_hevc_output_frame(void *ctx, int flush)
{

    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HEVCContext *s = (HEVCContext *)h265dctx->priv_data;
    MppDecCfgSet *cfg = h265dctx->cfg;
    RK_U32 find_next_ready = 0;

    if (cfg->base.fast_out)
        return mpp_hevc_out_dec_order(ctx);

    do {
        RK_S32 nb_output = 0;
        RK_S32 min_poc   = INT_MAX;
        RK_S32 min_idx = 0;
        RK_U32 i;

        for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
            HEVCFrame *frame = &s->DPB[i];
            if ((frame->flags & HEVC_FRAME_FLAG_OUTPUT) &&
                frame->sequence == s->seq_output) {
                nb_output++;
                if (frame->poc < min_poc) {
                    min_poc = frame->poc;
                    min_idx = i;
                }
            }
        }

        /* wait for more frames before output */
        if (!flush && s->seq_output == s->seq_decode && s->sps &&
            nb_output <= s->sps->temporal_layer[s->sps->max_sub_layers - 1].num_reorder_pics) {
            if (cfg->base.enable_fast_play && (IS_IDR(s) ||
                                               (IS_BLA(s) && !s->first_i_fast_play))) {
                s->first_i_fast_play = 1;
            } else {
                return 0;
            }
        }

        if (nb_output) {
            HEVCFrame *frame = &s->DPB[min_idx];

            frame->flags &= ~(HEVC_FRAME_FLAG_OUTPUT);
            s->output_frame_idx = min_idx;

            mpp_buf_slot_set_flag(s->slots, frame->slot_index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(s->slots, frame->slot_index, QUEUE_DISPLAY);

            h265d_dbg(H265D_DBG_REF,
                      "Output frame with POC %d frame->slot_index = %d\n", frame->poc, frame->slot_index);

            do {
                find_next_ready = 0;
                for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
                    HEVCFrame *frame_next_ready = &s->DPB[i];
                    if ((frame_next_ready->flags & HEVC_FRAME_FLAG_OUTPUT) &&
                        frame_next_ready->sequence == s->seq_output) {
                        if (frame_next_ready->poc == frame->poc + 1) {
                            find_next_ready = 1;
                            s->output_frame_idx = i;
                            frame_next_ready->flags &= ~(HEVC_FRAME_FLAG_OUTPUT);
                            frame = frame_next_ready;
                            mpp_buf_slot_set_flag(s->slots, frame->slot_index, SLOT_QUEUE_USE);
                            mpp_buf_slot_enqueue(s->slots, frame->slot_index, QUEUE_DISPLAY);
                            h265d_dbg(H265D_DBG_REF,
                                      "Output frame with POC %d frm_next_ready->slot_index = %d\n",
                                      frame_next_ready->poc, frame_next_ready->slot_index);
                            /* release any frames that are now unused */
                            for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
                                mpp_hevc_unref_frame(s, &s->DPB[i], 0);
                            }
                        }
                    }
                }
            } while (find_next_ready);

            return 1;
        }

        if (s->seq_output != s->seq_decode)
            s->seq_output = (s->seq_output + 1) & 0xff;
        else
            break;
    } while (1);

    return 0;
}